

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O2

bool embree::operator<(Token *a,Token *b)

{
  Type TVar1;
  Type TVar2;
  bool bVar3;
  bool bVar4;
  
  TVar2 = a->ty;
  TVar1 = b->ty;
  bVar4 = SBORROW4(TVar2,TVar1);
  bVar3 = (int)(TVar2 - TVar1) < 0;
  if (TVar2 == TVar1) {
    switch(TVar2) {
    case TY_CHAR:
      bVar4 = SBORROW1((a->field_1).c,(b->field_1).c);
      bVar3 = (char)((a->field_1).c - (b->field_1).c) < '\0';
      break;
    case TY_INT:
      bVar4 = SBORROW4((a->field_1).i,(b->field_1).i);
      bVar3 = (a->field_1).i - (b->field_1).i < 0;
      break;
    case TY_FLOAT:
      return (a->field_1).f <= (b->field_1).f && (b->field_1).f != (a->field_1).f;
    case TY_IDENTIFIER:
    case TY_STRING:
    case TY_SYMBOL:
      bVar3 = std::operator<(&a->str,&b->str);
      return bVar3;
    default:
      return false;
    }
  }
  return bVar4 != bVar3;
}

Assistant:

bool operator <( const Token& a, const Token& b ) {
      if (a.ty != b.ty) return (int)a.ty < (int)b.ty;
      if (a.ty == TY_CHAR) return a.c < b.c;
      if (a.ty == TY_INT) return a.i < b.i;
      if (a.ty == TY_FLOAT) return a.f < b.f;
      if (a.ty == TY_IDENTIFIER) return a.str < b.str;
      if (a.ty == TY_STRING) return a.str < b.str;
      if (a.ty == TY_SYMBOL) return a.str < b.str;
      return false;
    }